

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  undefined4 in_register_0000003c;
  secp256k1_ge *r;
  long lVar1;
  secp256k1_gej ai;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  
  r = (secp256k1_ge *)CONCAT44(in_register_0000003c,n);
  if ((int)z[3].n[0] == 0) {
    secp256k1_gej_double_var(&d,(secp256k1_gej *)z,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&d_ge,&d.x,&d.y);
    secp256k1_ge_set_gej_zinv(r,(secp256k1_gej *)z,&d.z);
    secp256k1_gej_set_ge(&ai,r);
    ai.z.n[0] = z[2].n[0];
    ai.z.n[1] = z[2].n[1];
    ai.z.n[2] = z[2].n[2];
    ai.z.n[3] = z[2].n[3];
    ai.z.n[4] = z[2].n[4];
    ai.z.magnitude = z[2].magnitude;
    ai.z.normalized = z[2].normalized;
    (pre_a->x).n[4] = d.z.n[4];
    (pre_a->x).magnitude = d.z.magnitude;
    (pre_a->x).normalized = d.z.normalized;
    (pre_a->x).n[2] = d.z.n[2];
    (pre_a->x).n[3] = d.z.n[3];
    (pre_a->x).n[0] = d.z.n[0];
    (pre_a->x).n[1] = d.z.n[1];
    for (lVar1 = 0x30; r = r + 1, lVar1 != 0xc0; lVar1 = lVar1 + 0x30) {
      secp256k1_gej_add_ge_var(&ai,&ai,&d_ge,(secp256k1_fe *)((long)(pre_a->x).n + lVar1));
      secp256k1_ge_set_xy(r,&ai.x,&ai.y);
    }
    secp256k1_fe_mul(zr,&ai.z,&d.z);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/ecmult_impl.h"
          ,0x4e,"test condition failed: !a->infinity");
  abort();
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}